

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsound_ctr.c
# Opt level: O3

void update_sample(qsound_chip *chip)

{
  uint uVar1;
  qsound_delay *pqVar2;
  qsound_delay *pqVar3;
  ushort uVar4;
  int iVar5;
  bool bVar6;
  UINT16 UVar7;
  int iVar8;
  long lVar9;
  short sVar10;
  short sVar11;
  UINT16 UVar12;
  uint uVar13;
  short sVar14;
  INT16 IVar15;
  int iVar16;
  int iVar17;
  bool bVar18;
  UINT8 UVar19;
  int iVar20;
  INT16 (*paIVar21) [95];
  ulong uVar22;
  ushort uVar23;
  short sVar24;
  int iVar25;
  ulong uVar26;
  INT16 IVar27;
  INT16 IVar28;
  int iVar29;
  long lVar30;
  INT16 IVar31;
  uint uVar32;
  uint uVar33;
  short sVar34;
  
  uVar23 = chip->state;
  if (uVar23 < 0x314) {
    if (uVar23 == 0x39) {
      lVar9 = 0;
      bVar18 = true;
      do {
        chip->filter[lVar9].tap_count = 0x5f;
        chip->filter[lVar9].delay_pos = 0;
        uVar23 = chip->filter[lVar9].table_pos;
        if ((uVar23 - 0xf2e & 0xffff) < 0xd1) {
          paIVar21 = (INT16 (*) [95])(qsound_filter_data2 + (uVar23 - 0xf2e));
LAB_00168158:
          memcpy(chip->filter[lVar9].taps,paIVar21,0xbe);
        }
        else if ((ushort)(uVar23 - 0xcf5) < 0x239) {
          iVar8 = (uint)uVar23 + (int)((ulong)((long)(int)(uVar23 - 0xd53) * -0x53896e7b) >> 0x20) +
                  -0xd53;
          paIVar21 = qsound_filter_data + (uint)((iVar8 >> 6) - (iVar8 >> 0x1f));
          goto LAB_00168158;
        }
        lVar9 = 1;
        bVar6 = !bVar18;
        bVar18 = false;
        if (bVar6) {
          chip->state = 0x314;
          chip->next_state = 0x314;
          return;
        }
      } while( true );
    }
    if (uVar23 == 0x4f) {
      lVar9 = 0;
      bVar18 = true;
      do {
        chip->filter[lVar9].tap_count = 0x2d;
        chip->filter[lVar9].delay_pos = 0;
        uVar23 = chip->filter[lVar9].table_pos;
        if ((uVar23 - 0xf2e & 0xffff) < 0xd1) {
          paIVar21 = (INT16 (*) [95])(qsound_filter_data2 + (uVar23 - 0xf2e));
LAB_00167e30:
          memcpy(chip->filter[lVar9].taps,paIVar21,0x5a);
        }
        else if ((ushort)(uVar23 - 0xcf5) < 0x239) {
          iVar8 = (uint)uVar23 + (int)((ulong)((long)(int)(uVar23 - 0xd53) * -0x53896e7b) >> 0x20) +
                  -0xd53;
          paIVar21 = qsound_filter_data + (uint)((iVar8 >> 6) - (iVar8 >> 0x1f));
          goto LAB_00167e30;
        }
        chip->alt_filter[lVar9].tap_count = 0x2c;
        chip->alt_filter[lVar9].delay_pos = 0;
        uVar23 = chip->alt_filter[lVar9].table_pos;
        if ((uVar23 - 0xf2e & 0xffff) < 0xd1) {
          paIVar21 = (INT16 (*) [95])(qsound_filter_data2 + (uVar23 - 0xf2e));
LAB_00167eb7:
          memcpy(chip->alt_filter[lVar9].taps,paIVar21,0x58);
        }
        else if ((ushort)(uVar23 - 0xcf5) < 0x239) {
          iVar8 = (uint)uVar23 + (int)((ulong)((long)(int)(uVar23 - 0xd53) * -0x53896e7b) >> 0x20) +
                  -0xd53;
          paIVar21 = qsound_filter_data + (uint)((iVar8 >> 6) - (iVar8 >> 0x1f));
          goto LAB_00167eb7;
        }
        lVar9 = 1;
        bVar6 = !bVar18;
        bVar18 = false;
        if (bVar6) {
          chip->state = 0x6b2;
          chip->next_state = 0x6b2;
          return;
        }
      } while( true );
    }
  }
  else if ((uVar23 == 0x314) || (uVar23 == 0x6b2)) {
    sVar10 = -0x554;
    if (uVar23 == 0x6b2) {
      sVar10 = -0x53c;
    }
    chip->ready_flag = 0x80;
    sVar10 = sVar10 + (chip->echo).end_pos;
    lVar9 = 0;
    sVar11 = 0;
    if (0 < sVar10) {
      sVar11 = sVar10;
    }
    if (0x3ff < sVar11) {
      sVar11 = 0x400;
    }
    (chip->echo).length = sVar11;
    uVar13 = chip->muteMask;
    lVar30 = 0;
    iVar8 = 0;
    do {
      uVar32 = 0;
      if ((uVar13 >> ((uint)lVar30 & 0x1f) & 1) == 0) {
        uVar23 = *(ushort *)((long)&chip->voice[0].bank + lVar9);
        uVar4 = *(ushort *)((long)&chip->voice[0].addr + lVar9);
        if (((short)uVar23 < 0 && chip->romMask != 0) &&
           (uVar33 = chip->romMask & ((uVar23 & 0x7fff) << 0x10 | (uint)uVar4), uVar32 = 0,
           uVar33 < chip->romSize)) {
          uVar32 = (uint)(short)((ushort)chip->romData[uVar33] << 8);
        }
        uVar33 = (uint)(*(ushort *)((long)&chip->voice[0].phase + lVar9) >> 4) +
                 (uint)*(ushort *)((long)&chip->voice[0].rate + lVar9) + (short)uVar4 * 0x1000;
        if ((int)*(short *)((long)&chip->voice[0].end_addr + lVar9) <= (int)uVar33 >> 0xc) {
          uVar33 = uVar33 + *(short *)((long)&chip->voice[0].loop_len + lVar9) * -0x1000;
        }
        uVar32 = uVar32 * (int)*(short *)((long)&chip->voice[0].volume + lVar9) >> 0xe;
        iVar8 = iVar8 + (int)*(short *)((long)&chip->voice[0].echo + lVar9) * (int)(short)uVar32 * 4
        ;
        if ((int)uVar33 < -0x7ffffff) {
          uVar33 = 0xf8000000;
        }
        if (0x7fffffe < (int)uVar33) {
          uVar33 = 0x7ffffff;
        }
        *(short *)((long)&chip->voice[0].addr + lVar9) = (short)(uVar33 >> 0xc);
        *(short *)((long)&chip->voice[0].phase + lVar9) = (short)(uVar33 << 4);
      }
      chip->voice_output[lVar30] = (INT16)uVar32;
      lVar30 = lVar30 + 1;
      lVar9 = lVar9 + 0x10;
    } while (lVar30 != 0x10);
    iVar5 = chip->state_counter;
    uVar32 = iVar5 % 3 + 0x10;
    if ((uVar13 >> (uVar32 & 0x1f) & 1) == 0) {
      iVar20 = iVar5 % 3;
      if (iVar5 + 2U < 5) {
        uVar23 = chip->adpcm[iVar20].cur_addr;
        if (uVar23 == chip->adpcm[iVar20].end_addr) {
          chip->adpcm[iVar20].cur_vol = 0;
        }
        if (chip->adpcm[iVar20].flag != 0) {
          chip->voice_output[uVar32] = 0;
          chip->adpcm[iVar20].flag = 0;
          chip->adpcm[iVar20].step_size = 10;
          uVar23 = chip->adpcm[iVar20].start_addr;
          chip->adpcm[iVar20].cur_vol = chip->adpcm[iVar20].volume;
          chip->adpcm[iVar20].cur_addr = uVar23;
        }
        uVar4 = chip->adpcm[iVar20].bank;
        UVar19 = '\0';
        if (((short)uVar4 < 0 && chip->romMask != 0) &&
           (uVar13 = chip->romMask & ((uint)uVar23 | (uVar4 & 0x7fff) << 0x10),
           uVar13 < chip->romSize)) {
          UVar19 = chip->romData[uVar13];
        }
      }
      else {
        uVar23 = chip->adpcm[iVar20].bank;
        uVar4 = chip->adpcm[iVar20].cur_addr;
        chip->adpcm[iVar20].cur_addr = uVar4 + 1;
        UVar19 = '\0';
        if (((short)uVar23 < 0 && chip->romMask != 0) &&
           (uVar13 = chip->romMask & ((uVar23 & 0x7fff) << 0x10 | (uint)uVar4),
           uVar13 < chip->romSize)) {
          UVar19 = chip->romData[uVar13] << 4;
        }
      }
      iVar16 = (int)(char)UVar19 >> 4;
      uVar13 = iVar16 * -2;
      if (iVar16 * -2 < 0) {
        uVar13 = iVar16 * 2;
      }
      iVar25 = (int)chip->adpcm[iVar20].step_size;
      iVar29 = (int)((uVar13 | 1) * iVar25) >> 1;
      iVar17 = -iVar29;
      if (0 < iVar16) {
        iVar17 = iVar29;
      }
      iVar17 = chip->voice_output[uVar32] + iVar17;
      iVar29 = -0x8000;
      if (-0x8000 < iVar17) {
        iVar29 = iVar17;
      }
      if (0x7ffe < iVar29) {
        iVar29 = 0x7fff;
      }
      chip->voice_output[uVar32] = (INT16)((uint)(chip->adpcm[iVar20].cur_vol * iVar29) >> 0x10);
      sVar11 = (short)((uint)(adpcm_step_table[iVar16 + 8] * iVar25) >> 6);
      sVar10 = 1;
      if (0 < sVar11) {
        sVar10 = sVar11;
      }
      sVar14 = 2000;
      if (sVar11 < 0x7d1) {
        sVar14 = sVar10;
      }
      chip->adpcm[iVar20].step_size = sVar14;
    }
    else {
      chip->voice_output[uVar32] = 0;
    }
    sVar10 = (chip->echo).delay_pos;
    sVar11 = (chip->echo).delay_line[sVar10];
    sVar14 = (chip->echo).last_sample;
    (chip->echo).last_sample = sVar11;
    iVar20 = (int)sVar14 + (int)sVar11 >> 1;
    (chip->echo).delay_pos = sVar10 + 1;
    (chip->echo).delay_line[sVar10] =
         (INT16)((uint)(iVar8 + (chip->echo).feedback * iVar20 * 4) >> 0x10);
    if ((chip->echo).length <= (chip->echo).delay_pos) {
      (chip->echo).delay_pos = 0;
    }
    uVar32 = iVar20 << 0xe;
    lVar9 = 0;
    uVar13 = 0;
    bVar18 = true;
    do {
      bVar6 = bVar18;
      uVar33 = 0;
      if (bVar6) {
        uVar33 = uVar32;
      }
      lVar30 = -0x26;
      do {
        uVar23 = *(short *)((long)chip->voice_output + lVar30) - 0x110;
        if (0x60 < uVar23) {
          uVar23 = 0x61;
        }
        iVar8 = (int)*(short *)((long)(chip->echo).delay_line + lVar30 + -8);
        uVar33 = uVar33 - chip->pan_tables[lVar9][0][uVar23] * iVar8;
        uVar13 = uVar13 - chip->pan_tables[lVar9][1][uVar23] * iVar8;
        lVar30 = lVar30 + 2;
      } while (lVar30 != 0);
      if ((int)uVar33 < -0x1ffffffe) {
        uVar33 = 0xe0000001;
      }
      if (0x1ffffffe < (int)uVar33) {
        uVar33 = 0x1fffffff;
      }
      if ((int)uVar13 < -0x1ffffffe) {
        uVar13 = 0xe0000001;
      }
      if (0x1ffffffe < (int)uVar13) {
        uVar13 = 0x1fffffff;
      }
      iVar8 = chip->filter[lVar9].tap_count;
      uVar1 = iVar8 - 1;
      uVar22 = (ulong)uVar1;
      if (iVar8 < 2) {
        iVar8 = chip->filter[lVar9].delay_pos;
        iVar20 = 0;
        uVar22 = 0;
      }
      else {
        iVar8 = chip->filter[lVar9].delay_pos;
        uVar26 = 0;
        iVar20 = 0;
        do {
          iVar16 = iVar8 + 1;
          iVar20 = iVar20 + (int)chip->filter[lVar9].delay_line[iVar8] *
                            (int)chip->filter[lVar9].taps[uVar26] * -4;
          iVar8 = iVar16;
          if ((int)uVar1 <= iVar16) {
            iVar8 = 0;
          }
          uVar26 = uVar26 + 1;
        } while (uVar22 != uVar26);
      }
      sVar10 = chip->filter[lVar9].taps[uVar22];
      chip->filter[lVar9].delay_pos = iVar8 + 1;
      sVar11 = (short)(uVar13 >> 0xe);
      chip->filter[lVar9].delay_line[iVar8] = sVar11;
      if ((int)uVar1 <= iVar8 + 1) {
        chip->filter[lVar9].delay_pos = 0;
      }
      if (chip->state == 0x6b2) {
        iVar8 = chip->alt_filter[lVar9].tap_count;
        uVar13 = iVar8 - 1;
        uVar22 = (ulong)uVar13;
        if (iVar8 < 2) {
          iVar8 = chip->alt_filter[lVar9].delay_pos;
          iVar16 = 0;
          uVar22 = 0;
        }
        else {
          iVar8 = chip->alt_filter[lVar9].delay_pos;
          uVar26 = 0;
          iVar16 = 0;
          do {
            iVar17 = iVar8 + 1;
            iVar16 = iVar16 + (int)chip->alt_filter[lVar9].delay_line[iVar8] *
                              (int)chip->alt_filter[lVar9].taps[uVar26] * -4;
            iVar8 = iVar17;
            if ((int)uVar13 <= iVar17) {
              iVar8 = 0;
            }
            uVar26 = uVar26 + 1;
          } while (uVar22 != uVar26);
        }
        sVar14 = chip->alt_filter[lVar9].taps[uVar22];
        chip->alt_filter[lVar9].delay_pos = iVar8 + 1;
        sVar34 = (short)(uVar33 >> 0xe);
        chip->alt_filter[lVar9].delay_line[iVar8] = sVar34;
        if ((int)uVar13 <= iVar8 + 1) {
          chip->alt_filter[lVar9].delay_pos = 0;
        }
        IVar15 = (INT16)((uint)(iVar16 + (int)sVar34 * (int)sVar14 * -4) >> 0x10);
      }
      else {
        IVar15 = (INT16)((uVar33 << 2) >> 0x10);
      }
      pqVar2 = chip->wet + lVar9;
      sVar14 = chip->wet[lVar9].write_pos;
      chip->wet[lVar9].write_pos = sVar14 + 1;
      pqVar2->delay_line[sVar14] = (INT16)((uint)(iVar20 + (int)sVar11 * (int)sVar10 * -4) >> 0x10);
      if (0x32 < chip->wet[lVar9].write_pos) {
        pqVar2->write_pos = 0;
      }
      sVar10 = pqVar2->read_pos;
      IVar27 = sVar10 + 1;
      pqVar2->read_pos = IVar27;
      sVar10 = pqVar2->delay_line[sVar10];
      sVar11 = pqVar2->volume;
      if (0x32 < IVar27) {
        IVar27 = 0;
      }
      pqVar2->read_pos = IVar27;
      pqVar3 = chip->dry + lVar9;
      sVar14 = chip->dry[lVar9].write_pos;
      chip->dry[lVar9].write_pos = sVar14 + 1;
      pqVar3->delay_line[sVar14] = IVar15;
      sVar14 = chip->dry[lVar9].write_pos;
      if (0x32 < sVar14) {
        pqVar3->write_pos = 0;
        sVar14 = 0;
      }
      sVar34 = pqVar3->read_pos;
      sVar24 = sVar34 + 1;
      pqVar3->read_pos = sVar24;
      if (0x32 < sVar24) {
        sVar24 = 0;
      }
      iVar8 = (int)sVar11 * (int)sVar10 + (int)pqVar3->volume * (int)pqVar3->delay_line[sVar34] +
              0x2000 >> 0xe;
      if (iVar8 < -0x7ffe) {
        iVar8 = -0x7fff;
      }
      IVar15 = (INT16)iVar8;
      if (0x7ffe < iVar8) {
        IVar15 = 0x7fff;
      }
      pqVar3->read_pos = sVar24;
      chip->out[lVar9] = IVar15;
      if (chip->delay_update != 0) {
        iVar8 = (int)pqVar2->write_pos - (int)pqVar2->delay;
        sVar10 = (short)iVar8 + 0x33 + (short)(iVar8 / 0x33) * -0x33;
        if (-1 < iVar8 % 0x33) {
          sVar10 = (short)(iVar8 % 0x33);
        }
        pqVar2->read_pos = sVar10;
        iVar8 = (int)sVar14 - (int)pqVar3->delay;
        sVar10 = (short)iVar8 + 0x33 + (short)(iVar8 / 0x33) * -0x33;
        if (-1 < iVar8 % 0x33) {
          sVar10 = (short)(iVar8 % 0x33);
        }
        pqVar3->read_pos = sVar10;
      }
      lVar9 = 1;
      uVar13 = uVar32;
      bVar18 = false;
    } while (bVar6);
    chip->delay_update = 0;
    chip->state_counter = iVar5 + 1;
    if (iVar5 < 5) {
      return;
    }
    goto LAB_0016872f;
  }
  if (chip->state_counter < 2) {
    if (chip->state_counter == 1) {
      chip->state_counter = 2;
      return;
    }
    memset(chip->voice,0,0x130);
    memset(&(chip->echo).feedback,0,0xfe0);
    lVar9 = -0x26;
    do {
      *(undefined2 *)((long)chip->voice_output + lVar9) = 0x120;
      *(undefined2 *)((long)(chip->echo).delay_line + lVar9 + -8) = 0;
      lVar9 = lVar9 + 2;
    } while (lVar9 != 0);
    lVar9 = 0;
    do {
      *(undefined2 *)((long)&chip->voice[0].bank + lVar9) = 0x8000;
      lVar9 = lVar9 + 0x10;
    } while (lVar9 != 0x100);
    chip->adpcm[0].bank = 0x8000;
    chip->adpcm[1].bank = 0x8000;
    chip->adpcm[2].bank = 0x8000;
    if (uVar23 != 0x61a) {
      UVar7 = 0x39;
      UVar12 = 0x55a;
      IVar15 = 0xe11;
      IVar27 = 0xdb2;
      IVar31 = 0x30;
      IVar28 = 0x2e;
    }
    else {
      chip->alt_filter[0].table_pos = 0xf73;
      chip->alt_filter[1].table_pos = 0xfa4;
      UVar7 = 0x4f;
      UVar12 = 0x542;
      IVar15 = 0xfa4;
      IVar27 = 0xf73;
      IVar28 = 0;
      IVar31 = 0;
    }
    chip->wet[0].delay = (ushort)(uVar23 == 0x61a);
    chip->dry[0].delay = IVar28;
    chip->wet[1].delay = 0;
    chip->wet[1].volume = 0x3fff;
    chip->dry[1].delay = IVar31;
    chip->filter[0].table_pos = IVar27;
    chip->filter[1].table_pos = IVar15;
    (chip->echo).end_pos = UVar12;
    chip->next_state = UVar7;
    chip->wet[0].volume = 0x3fff;
    chip->dry[0].volume = 0x3fff;
    chip->dry[1].volume = 0x3fff;
    chip->delay_update = 1;
    chip->ready_flag = '\0';
    chip->state_counter = 1;
    return;
  }
LAB_0016872f:
  chip->state_counter = 0;
  chip->state = chip->next_state;
  return;
}

Assistant:

static void update_sample(struct qsound_chip *chip)
{
	switch(chip->state)
	{
		default:
		case STATE_INIT1:
		case STATE_INIT2:
			state_init(chip);
			return;
		case STATE_REFRESH1:
			state_refresh_filter_1(chip);
			return;
		case STATE_REFRESH2:
			state_refresh_filter_2(chip);
			return;
		case STATE_NORMAL1:
		case STATE_NORMAL2:
			state_normal_update(chip);
			return;
	}
}